

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-bookmarks.cc
# Opt level: O2

void extract_bookmarks(vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
                       *outlines,vector<int,_std::allocator<int>_> *numbers)

{
  QPDFOutlineObjectHelper *pQVar1;
  int *piVar2;
  QPDFOutlineObjectHelper *pQVar3;
  int local_a4;
  unsigned_long local_a0;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_98 [24];
  _Vector_base<int,_std::allocator<int>_> local_80;
  QPDFOutlineObjectHelper local_68;
  
  local_a4 = 0;
  if (style == st_lines) {
    local_a0 = (*(long *)(outlines + 8) - *(long *)outlines) / 0x38;
    local_a4 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert(&local_a0);
    local_a4 = -local_a4;
  }
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(numbers,&local_a4);
  pQVar1 = *(QPDFOutlineObjectHelper **)(outlines + 8);
  for (pQVar3 = *(QPDFOutlineObjectHelper **)outlines;
      piVar2 = (numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish + -1, pQVar3 != pQVar1; pQVar3 = pQVar3 + 1) {
    *piVar2 = *piVar2 + 1;
    QPDFOutlineObjectHelper::QPDFOutlineObjectHelper(&local_68,pQVar3);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_80,numbers);
    show_bookmark_details(&local_68,(vector<int,_std::allocator<int>_> *)&local_80);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_80);
    QPDFOutlineObjectHelper::~QPDFOutlineObjectHelper(&local_68);
    QPDFOutlineObjectHelper::getKids();
    extract_bookmarks(local_98,numbers);
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
              (local_98);
  }
  (numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = piVar2;
  return;
}

Assistant:

void
extract_bookmarks(std::vector<QPDFOutlineObjectHelper> outlines, std::vector<int>& numbers)
{
    // For style == st_numbers, numbers.at(n) contains the numerical label for the outline, so we
    // count up from 1.
    // For style == st_lines, numbers.at(n) == 0 indicates the last outline at level n, and we don't
    // otherwise care what the value is, so we count up to zero.
    numbers.push_back((style == st_lines) ? -QIntC::to_int(outlines.size()) : 0);
    for (auto& outline: outlines) {
        ++(numbers.back());
        show_bookmark_details(outline, numbers);
        extract_bookmarks(outline.getKids(), numbers);
    }
    numbers.pop_back();
}